

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# midi_processor_xmi.cpp
# Opt level: O3

uint __thiscall iff_chunk::get_chunk_count(iff_chunk *this,char *p_id)

{
  uint uVar1;
  long lVar2;
  pointer piVar3;
  
  piVar3 = (this->m_sub_chunks).super__Vector_base<iff_chunk,_std::allocator<iff_chunk>_>._M_impl.
           super__Vector_impl_data._M_start;
  lVar2 = (long)(this->m_sub_chunks).super__Vector_base<iff_chunk,_std::allocator<iff_chunk>_>.
                _M_impl.super__Vector_impl_data._M_finish - (long)piVar3;
  if (lVar2 != 0) {
    lVar2 = (lVar2 >> 3) * 0x6db6db6db6db6db7;
    lVar2 = lVar2 + (ulong)(lVar2 == 0);
    uVar1 = 0;
    do {
      uVar1 = uVar1 + (*(int *)p_id == *(int *)piVar3->m_id);
      piVar3 = piVar3 + 1;
      lVar2 = lVar2 + -1;
    } while (lVar2 != 0);
    return uVar1;
  }
  return 0;
}

Assistant:

unsigned get_chunk_count( const char * p_id ) const
    {
        unsigned chunk_count = 0;
        for ( std::size_t i = 0; i < m_sub_chunks.size(); ++i )
        {
            if ( !memcmp( p_id, m_sub_chunks[ i ].m_id, 4 ) )
            {
                ++chunk_count;
            }
        }
        return chunk_count;
    }